

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall DQuickSaveMenu::HandleResult(DQuickSaveMenu *this,bool res)

{
  char *filename;
  float volume;
  FSoundID local_18;
  undefined1 local_11;
  DQuickSaveMenu *pDStack_10;
  bool res_local;
  DQuickSaveMenu *this_local;
  
  local_11 = res;
  pDStack_10 = this;
  if (res) {
    filename = FString::GetChars(&quickSaveSlot->Filename);
    G_SaveGame(filename,quickSaveSlot->Title);
    FSoundID::FSoundID(&local_18,"menu/dismiss");
    volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_18,volume,0.0);
    M_ClearMenus();
  }
  else {
    (*(this->super_DMessageBoxMenu).super_DMenu.super_DObject._vptr_DObject[0xd])();
    DMessageBoxMenu::CloseSound(&this->super_DMessageBoxMenu);
  }
  return;
}

Assistant:

void DQuickSaveMenu::HandleResult(bool res)
{
	if (res)
	{
		G_SaveGame (quickSaveSlot->Filename.GetChars(), quickSaveSlot->Title);
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/dismiss", snd_menuvolume, ATTN_NONE);
		M_ClearMenus();
	}
	else
	{
		Close();
		CloseSound();
	}
}